

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxAbs::FxAbs(FxAbs *this,FxExpression *v)

{
  FxExpression *v_local;
  FxAbs *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Abs,&v->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxAbs_00a0a928;
  this->val = v;
  (this->super_FxExpression).ValueType = v->ValueType;
  return;
}

Assistant:

FxAbs::FxAbs(FxExpression *v)
: FxExpression(EFX_Abs, v->ScriptPosition)
{
	val = v;
	ValueType = v->ValueType;
}